

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

int Gia_ManBuiltInSimPack(Gia_Man_t *p,Vec_Int_t *vPat)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  word *pwVar5;
  uint uVar6;
  int i;
  
  iVar2 = vPat->nSize;
  if (iVar2 < 1) {
    __assert_fail("Vec_IntSize(vPat) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x3b5,"int Gia_ManBuiltInSimPack(Gia_Man_t *, Vec_Int_t *)");
  }
  uVar6 = 0;
  do {
    if (p->iPatsPi <= (int)uVar6) {
      return -1;
    }
    for (i = 0; i < iVar2; i = i + 1) {
      iVar2 = Vec_IntEntry(vPat,i);
      iVar3 = Abc_Lit2Var(iVar2);
      pwVar5 = Gia_ManBuiltInDataPi(p,iVar3);
      if ((pwVar5[uVar6 >> 6] & 1L << (sbyte)(uVar6 & 0x3f)) != 0) {
        iVar3 = Abc_Lit2Var(iVar2);
        pwVar5 = Gia_ManBuiltInData(p,iVar3 + 1);
        uVar1 = pwVar5[uVar6 >> 6];
        uVar4 = Abc_LitIsCompl(iVar2);
        if (((uVar1 >> (ulong)(uVar6 & 0x3f) & 1) != 0) == uVar4) {
          iVar2 = vPat->nSize;
          break;
        }
      }
      iVar2 = vPat->nSize;
    }
    if (iVar2 == i) {
      return uVar6;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int Gia_ManBuiltInSimPack( Gia_Man_t * p, Vec_Int_t * vPat )
{
    int i, k, iLit;
    assert( Vec_IntSize(vPat) > 0 );
    //printf( "%d ", Vec_IntSize(vPat) );
    for ( i = 0; i < p->iPatsPi; i++ )
    {
        Vec_IntForEachEntry( vPat, iLit, k )
            if ( Abc_TtGetBit(Gia_ManBuiltInDataPi(p, Abc_Lit2Var(iLit)), i) && 
                 Abc_TtGetBit(Gia_ManBuiltInData(p, 1+Abc_Lit2Var(iLit)), i) == Abc_LitIsCompl(iLit) )
                break;
        if ( k == Vec_IntSize(vPat) )
            return i; // success
    }
    return -1; // failure
}